

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignEvaluator.h
# Opt level: O0

void Eigen::internal::
     call_assignment<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Product<Eigen::TriangularView<Eigen::Matrix<double,_1,_1,1,_1,_1>,2u>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>,Eigen::internal::assign_op<double,double>>
               (Matrix<double,__1,__1,_0,__1,__1> *dst,
               Product<Eigen::TriangularView<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_2U>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>
               *src,assign_op<double,_double> *func,type param_4)

{
  undefined1 local_40 [8];
  type tmp;
  type param_3_local;
  assign_op<double,_double> *func_local;
  Product<Eigen::TriangularView<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_2U>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>
  *src_local;
  Matrix<double,__1,__1,_0,__1,__1> *dst_local;
  
  tmp.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols =
       (Index)param_4;
  Matrix<double,-1,-1,0,-1,-1>::
  Matrix<Eigen::Product<Eigen::TriangularView<Eigen::Matrix<double,_1,_1,1,_1,_1>,2u>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>>
            ((Matrix<double,_1,_1,0,_1,_1> *)local_40,src);
  call_assignment_no_alias<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::internal::assign_op<double,double>>
            (dst,(Matrix<double,__1,__1,_0,__1,__1> *)local_40,func);
  Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)local_40);
  return;
}

Assistant:

EIGEN_DEVICE_FUNC EIGEN_STRONG_INLINE
void call_assignment(Dst& dst, const Src& src, const Func& func, typename enable_if< evaluator_assume_aliasing<Src>::value, void*>::type = 0)
{
  typename plain_matrix_type<Src>::type tmp(src);
  call_assignment_no_alias(dst, tmp, func);
}